

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O0

bool duckdb::PhysicalOperator::OperatorCachingAllowed(ExecutionContext *context)

{
  bool bVar1;
  Pipeline *pPVar2;
  PhysicalOperator *pPVar3;
  long *in_RDI;
  OperatorPartitionInfo partition_info;
  optional_ptr<duckdb::Pipeline,_true> *in_stack_ffffffffffffffa0;
  OperatorPartitionInfo *this;
  Pipeline *in_stack_ffffffffffffffd8;
  PhysicalOperator *local_18 [2];
  byte local_1;
  
  if ((*(byte *)(*in_RDI + 0xe5) & 1) == 0) {
    local_1 = 0;
  }
  else {
    bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)(in_RDI + 2));
    if (bVar1) {
      pPVar2 = optional_ptr<duckdb::Pipeline,_true>::operator->(in_stack_ffffffffffffffa0);
      local_18[0] = (PhysicalOperator *)Pipeline::GetSink(pPVar2);
      bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)local_18);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        optional_ptr<duckdb::Pipeline,_true>::operator->(in_stack_ffffffffffffffa0);
        bVar1 = Pipeline::IsOrderDependent(in_stack_ffffffffffffffd8);
        if (bVar1) {
          local_1 = 0;
        }
        else {
          pPVar2 = optional_ptr<duckdb::Pipeline,_true>::operator->(in_stack_ffffffffffffffa0);
          Pipeline::GetSink(pPVar2);
          pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->
                             ((optional_ptr<duckdb::PhysicalOperator,_true> *)
                              in_stack_ffffffffffffffa0);
          this = (OperatorPartitionInfo *)&stack0xffffffffffffffc8;
          (*pPVar3->_vptr_PhysicalOperator[0x23])();
          bVar1 = OperatorPartitionInfo::AnyRequired(this);
          if (bVar1) {
            local_1 = 0;
          }
          OperatorPartitionInfo::~OperatorPartitionInfo((OperatorPartitionInfo *)0x79fd30);
          if (!bVar1) {
            local_1 = 1;
          }
        }
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool PhysicalOperator::OperatorCachingAllowed(ExecutionContext &context) {
	if (!context.client.config.enable_caching_operators) {
		return false;
	} else if (!context.pipeline) {
		return false;
	} else if (!context.pipeline->GetSink()) {
		return false;
	} else if (context.pipeline->IsOrderDependent()) {
		return false;
	} else {
		auto partition_info = context.pipeline->GetSink()->RequiredPartitionInfo();
		if (partition_info.AnyRequired()) {
			return false;
		}
	}

	return true;
}